

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

FILE * open_input(char *filename)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  FILE *pFVar4;
  char *__dest;
  long lVar5;
  int iVar6;
  
  sVar3 = strlen(filename);
  iVar6 = (int)sVar3;
  lVar5 = 0;
  do {
    pcVar1 = *(char **)((long)&PTR_anon_var_dwarf_2494e_0025cd80 + lVar5);
    sVar3 = strlen(pcVar1);
    if ((int)sVar3 < iVar6) {
      iVar2 = strcmp(filename + ((long)iVar6 - (long)(int)sVar3),pcVar1);
      if (iVar2 == 0) {
        pcVar1 = *(char **)((long)&DAT_0025cd88 + lVar5);
        sVar3 = strlen(pcVar1);
        __dest = (char *)malloc((long)iVar6 + sVar3 + 2);
        strcpy(__dest,pcVar1);
        sVar3 = strlen(__dest);
        (__dest + sVar3)[0] = ' ';
        (__dest + sVar3)[1] = '\0';
        strcat(__dest,filename);
        pFVar4 = popen(__dest,"r");
        free(__dest);
        return (FILE *)pFVar4;
      }
    }
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  pFVar4 = fopen(filename,"r");
  return (FILE *)pFVar4;
}

Assistant:

FILE *open_input(const char *filename) {
	const char * const tab[][2] = {
		{ ".gz", "zcat" },
		{ ".Z", "zcat" },
		{ ".bz2", "bzcat" },
		{ ".xz", "xzcat" },
	};
	int i;
	int flen = strlen(filename);
	for (i = 0; i < sizeof tab / sizeof tab[0]; i++) {
		int elen = strlen(tab[i][0]);
		if (flen > elen && !strcmp(filename + flen - elen, tab[i][0])) {
			char *cmd = malloc(flen + strlen(tab[i][1]) + 2);
			FILE *res;
			strcpy(cmd, tab[i][1]);
			strcat(cmd, " ");
			strcat(cmd, filename);
			res = popen(cmd, "r");
			free(cmd);
			return res;
		}
	}
	return fopen(filename, "r");
}